

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O0

int IPdr_ManRebuildClauses(Pdr_Man_t *p,Vec_Vec_t *vClauses)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Pdr_Set_t *pCube_00;
  uint local_40;
  int nCubes;
  int RetValue;
  int j;
  int i;
  Pdr_Set_t *pCube;
  Vec_Ptr_t *vArrayK;
  Vec_Vec_t *vClauses_local;
  Pdr_Man_t *p_local;
  
  local_40 = 0;
  if (vClauses == (Vec_Vec_t *)0x0) {
    p_local._4_4_ = -1;
  }
  else {
    iVar1 = Vec_VecSize(vClauses);
    if (iVar1 < 2) {
      __assert_fail("Vec_VecSize(vClauses) >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                    ,0x10b,"int IPdr_ManRebuildClauses(Pdr_Man_t *, Vec_Vec_t *)");
    }
    iVar1 = Vec_VecSize(p->vClauses);
    if (iVar1 != 0) {
      __assert_fail("Vec_VecSize(p->vClauses) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                    ,0x10c,"int IPdr_ManRebuildClauses(Pdr_Man_t *, Vec_Vec_t *)");
    }
    Vec_VecExpand(p->vClauses,1);
    IPdr_ManSetSolver(p,0,1);
    for (RetValue = 1; iVar1 = Vec_VecSize(vClauses), RetValue < iVar1; RetValue = RetValue + 1) {
      pVVar3 = Vec_VecEntry(vClauses,RetValue);
      for (nCubes = 0; iVar1 = Vec_PtrSize(pVVar3), nCubes < iVar1; nCubes = nCubes + 1) {
        pCube_00 = (Pdr_Set_t *)Vec_PtrEntry(pVVar3,nCubes);
        local_40 = local_40 + 1;
        iVar1 = Pdr_ManCheckCube(p,0,pCube_00,(Pdr_Set_t **)0x0,0,0,1);
        Vec_IntWriteEntry(p->vActVars,0,0);
        if (iVar1 == -1) {
          __assert_fail("RetValue != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                        ,0x11b,"int IPdr_ManRebuildClauses(Pdr_Man_t *, Vec_Vec_t *)");
        }
        if (iVar1 == 0) {
          Abc_Print(1,"Cube[%d][%d] cannot be pushed from R0 to R1.\n",(ulong)(uint)RetValue,
                    (ulong)(uint)nCubes);
          Pdr_SetDeref(pCube_00);
        }
        else {
          Vec_VecPush(p->vClauses,1,pCube_00);
        }
      }
    }
    pVVar3 = Vec_VecEntry(p->vClauses,1);
    uVar2 = Vec_PtrSize(pVVar3);
    Abc_Print(1,"RebuildClauses: %d out of %d cubes reused in R1.\n",(ulong)uVar2,(ulong)local_40);
    IPdr_ManSetSolver(p,1,0);
    Vec_VecFree(vClauses);
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int IPdr_ManRebuildClauses( Pdr_Man_t * p, Vec_Vec_t * vClauses )
{
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pCube;
    int i, j;
    int RetValue = -1;
    int nCubes = 0;

    if ( vClauses == NULL )
        return RetValue;

    assert( Vec_VecSize(vClauses) >= 2 );
    assert( Vec_VecSize(p->vClauses) == 0 ); 
    Vec_VecExpand( p->vClauses, 1 );

    IPdr_ManSetSolver( p, 0, 1 );

    // push clauses from R0 to R1
    Vec_VecForEachLevelStart( vClauses, vArrayK, i, 1 )
    {
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCube, j )
        {
            ++nCubes;

            RetValue = Pdr_ManCheckCube( p, 0, pCube, NULL, 0, 0, 1 );
            Vec_IntWriteEntry( p->vActVars, 0, 0 );

            assert( RetValue != -1 );

            if ( RetValue == 0 )
            {
                Abc_Print( 1, "Cube[%d][%d] cannot be pushed from R0 to R1.\n", i, j );
                Pdr_SetDeref( pCube );
                continue;
            }

            Vec_VecPush( p->vClauses, 1, pCube );
        }
    }
    Abc_Print( 1, "RebuildClauses: %d out of %d cubes reused in R1.\n", Vec_PtrSize(Vec_VecEntry(p->vClauses, 1)), nCubes );
    IPdr_ManSetSolver( p, 1, 0 );
    Vec_VecFree( vClauses );

    /*
    for ( i = 1; i < Vec_VecSize( vClauses ) - 1; ++i )
    {
        vArrayK = IPdr_ManPushClausesK( p, i );
        if ( Vec_PtrSize(vArrayK) == 0 )
        {
            Abc_Print( 1, "RebuildClauses: stopped at frame %d.\n", i );
            break;
        }

        Vec_PtrGrow( (Vec_Ptr_t *)(p->vClauses), i + 2 );
        p->vClauses->nSize = i + 2;
        p->vClauses->pArray[i+1] = vArrayK;
        IPdr_ManSetSolver( p, i + 1, 0 );
    }

    Abc_Print( 1, "After rebuild:" );
    Vec_VecForEachLevel( p->vClauses, vArrayK, i )
        Abc_Print( 1, " %d", Vec_PtrSize( vArrayK ) );
    Abc_Print( 1, "\n" );
    */

    return 0;
}